

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O3

string * __thiscall
libtorrent::aux::http_parser::header_abi_cxx11_(http_parser *this,string_view key)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = key._M_str;
  local_18._M_len = key._M_len;
  if (header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_ ==
      '\0') {
    header_abi_cxx11_();
  }
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->m_header,&local_18);
  p_Var2 = (_Base_ptr)
           &header[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_
  ;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_header)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = cVar1._M_node + 2;
  }
  return (string *)p_Var2;
}

Assistant:

std::string const& http_parser::header(string_view const key) const
	{
		static std::string const empty;
		// at least GCC-5.4 for ARM (on travis) has a libstdc++ whose debug map$
		// doesn't seem to support transparent comparators$
#if ! defined _GLIBCXX_DEBUG
		auto const i = m_header.find(key);
#else
		auto const i = m_header.find(std::string(key));
#endif
		if (i == m_header.end()) return empty;
		return i->second;
	}